

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGeometry.h
# Opt level: O2

ChMatrix33<double> *
chrono::utils::CalcCapsuleGyration
          (ChMatrix33<double> *__return_storage_ptr__,double radius,double hlen,
          ChVector<double> *pos,ChQuaternion<double> *rot)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar5 [64];
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  auVar5._8_56_ = in_register_00001248;
  auVar5._0_8_ = hlen;
  auVar3._8_56_ = in_register_00001208;
  auVar3._0_8_ = radius;
  auVar1 = auVar3._0_16_;
  auVar11 = vfmadd213sd_fma(ZEXT816(0x3fd8000000000000),auVar1,auVar5._0_16_);
  dVar6 = (hlen * 1.5) / radius;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = hlen * 4.0 * hlen;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = radius * 3.0;
  auVar2 = vfmadd231sd_fma(auVar4,auVar1,auVar12);
  dVar10 = dVar6 + 1.0;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = auVar11._0_8_ * auVar11._0_8_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = radius * 0.259;
  auVar11 = vfmadd231sd_fma(auVar7,auVar1,auVar13);
  dVar6 = dVar6 / dVar10;
  dVar10 = 1.0 / dVar10;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = auVar11._0_8_ * dVar10;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar6 * 0.08333333333333333;
  auVar11 = vfmadd231sd_fma(auVar8,auVar11,auVar2);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = radius * radius;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = radius * radius * dVar10 * 0.4;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar6 * 0.5;
  auVar2 = vfmadd231sd_fma(auVar1,auVar2,auVar9);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)__return_storage_ptr__);
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar11._0_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar2._0_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar11._0_8_;
  return __return_storage_ptr__;
}

Assistant:

inline ChMatrix33<> CalcCapsuleGyration(double radius,
                                        double hlen,
                                        const ChVector<>& pos = ChVector<>(0, 0, 0),
                                        const ChQuaternion<>& rot = ChQuaternion<>(1, 0, 0, 0)) {
    double massRatio = 1.5 * hlen / radius;
    double cmDist = hlen + 3.0 / 8 * radius;
    double Ixx = massRatio / (1 + massRatio) * (1.0 / 12.0) * (3 * radius * radius + 4 * hlen * hlen) +
                 1 / (1 + massRatio) * (0.259 * radius * radius + cmDist * cmDist);
    double Iyy = massRatio / (1 + massRatio) * (1.0 / 2.0) * (radius * radius) +
                 1 / (1 + massRatio) * (2.0 / 5.0) * (radius * radius);

    ChMatrix33<> J;
    J.setZero();
    J(0, 0) = Ixx;
    J(1, 1) = Iyy;
    J(2, 2) = Ixx;

    TransformGyration(J, pos, rot);

    return J;
}